

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O1

void __thiscall
google::protobuf::AssignDescriptorsHelper::AssignMessageDescriptor
          (AssignDescriptorsHelper *this,Descriptor *descriptor)

{
  uint uVar1;
  uint32_t *puVar2;
  MigrationSchema MVar3;
  Message *pMVar4;
  MessageFactory *pMVar5;
  int iVar6;
  undefined4 extraout_var;
  long *arg;
  DescriptorPool *pDVar7;
  undefined8 extraout_RAX;
  uint uVar8;
  long lVar9;
  uint32_t *puVar10;
  uint32_t uVar11;
  uint32_t uVar12;
  uint32_t uVar13;
  void *unaff_R12;
  uint32_t *puVar14;
  int iVar15;
  long lVar16;
  uint32_t local_88;
  uint32_t local_84;
  uint32_t local_80;
  uint32_t local_7c;
  char local_78;
  
  if (0 < descriptor->nested_type_count_) {
    lVar16 = 0;
    unaff_R12 = (void *)0x0;
    do {
      AssignMessageDescriptor
                (this,(Descriptor *)(&descriptor->nested_types_->super_SymbolBase + lVar16));
      unaff_R12 = (void *)((long)unaff_R12 + 1);
      lVar16 = lVar16 + 0xa0;
    } while ((long)unaff_R12 < (long)descriptor->nested_type_count_);
  }
  if (*this->default_instance_data_ != (Message *)0x0) {
    iVar6 = (*((*this->default_instance_data_)->super_MessageLite)._vptr_MessageLite[4])();
    lVar16 = CONCAT44(extraout_var,iVar6);
    if (*(char *)(lVar16 + 0x3c) == '\x01') {
      AssignMessageDescriptor((AssignDescriptorsHelper *)&stack0xffffffffffffffc0);
      if (local_78 != '\0') {
        operator_delete(unaff_R12,0x70);
      }
      _Unwind_Resume(extraout_RAX);
    }
    if (*(long *)(lVar16 + 0x48) != 0) {
      *(Descriptor **)(lVar16 + 0x58) = descriptor;
      arg = (long *)operator_new(0x70);
      puVar2 = this->offsets_;
      MVar3 = *this->schemas_;
      iVar6 = MVar3.offsets_index;
      iVar15 = iVar6 + 1;
      uVar1 = puVar2[iVar6];
      uVar11 = 0xffffffff;
      if ((uVar1 & 1) == 0) {
        local_7c = 0xffffffff;
      }
      else {
        lVar9 = (long)iVar15;
        iVar15 = iVar6 + 2;
        local_7c = puVar2[lVar9];
      }
      if ((uVar1 & 2) != 0) {
        lVar9 = (long)iVar15;
        iVar15 = iVar15 + 1;
        uVar11 = puVar2[lVar9];
      }
      uVar12 = 0xffffffff;
      if ((uVar1 & 4) == 0) {
        local_80 = 0xffffffff;
      }
      else {
        lVar9 = (long)iVar15;
        iVar15 = iVar15 + 1;
        local_80 = puVar2[lVar9];
      }
      if ((uVar1 & 8) != 0) {
        lVar9 = (long)iVar15;
        iVar15 = iVar15 + 1;
        uVar12 = puVar2[lVar9];
      }
      uVar13 = 0xffffffff;
      if ((uVar1 & 0x10) == 0) {
        local_84 = 0xffffffff;
      }
      else {
        lVar9 = (long)iVar15;
        iVar15 = iVar15 + 1;
        local_84 = puVar2[lVar9];
      }
      if ((uVar1 & 0x20) != 0) {
        lVar9 = (long)iVar15;
        iVar15 = iVar15 + 1;
        uVar13 = puVar2[lVar9];
      }
      uVar8 = 0xffffffff;
      if ((uVar1 & 0x40) == 0) {
        local_88 = 0xffffffff;
      }
      else {
        lVar9 = (long)iVar15;
        iVar15 = iVar15 + 1;
        local_88 = puVar2[lVar9];
      }
      if ((char)uVar1 < '\0') {
        lVar9 = (long)iVar15;
        iVar15 = iVar15 + 1;
        uVar8 = puVar2[lVar9];
      }
      puVar14 = (uint32_t *)0x0;
      if (uVar8 != 0xffffffff) {
        puVar14 = puVar2 + (long)iVar6 + (ulong)uVar8;
      }
      uVar8 = 0xffffffff;
      if ((uVar1 >> 8 & 1) != 0) {
        lVar9 = (long)iVar15;
        iVar15 = iVar15 + 1;
        uVar8 = puVar2[lVar9];
      }
      pMVar4 = *this->default_instance_data_;
      pDVar7 = DescriptorPool::internal_generated_pool();
      puVar10 = (uint32_t *)0x0;
      if (uVar8 != 0xffffffff) {
        puVar10 = puVar2 + (long)iVar6 + (ulong)uVar8;
      }
      pMVar5 = this->factory_;
      *arg = (long)descriptor;
      arg[1] = (long)pMVar4;
      arg[2] = (long)(puVar2 + iVar15);
      arg[3] = (long)puVar14;
      *(uint32_t *)(arg + 4) = local_7c;
      *(uint32_t *)((long)arg + 0x24) = uVar11;
      *(uint32_t *)(arg + 5) = local_80;
      *(int *)((long)arg + 0x2c) = MVar3.object_size;
      *(uint32_t *)(arg + 6) = uVar12;
      arg[7] = (long)puVar10;
      *(uint32_t *)(arg + 8) = local_84;
      *(uint32_t *)((long)arg + 0x44) = uVar13;
      *(uint32_t *)(arg + 9) = local_88;
      if (pDVar7 == (DescriptorPool *)0x0) {
        pDVar7 = DescriptorPool::internal_generated_pool();
      }
      arg[10] = (long)pDVar7;
      arg[0xb] = (long)pMVar5;
      arg[0xc] = 0xffffffff;
      arg[0xd] = 0;
      *(int *)(arg + 0xc) = *(int *)(*arg + 8) + -1;
      internal::OnShutdownRun
                (internal::OnShutdownDelete<google::protobuf::Reflection>::anon_class_1_0_00000001::
                 __invoke,arg);
      *(long **)(lVar16 + 0x50) = arg;
    }
  }
  iVar6 = descriptor->enum_type_count_;
  if (0 < (long)iVar6) {
    lVar16 = 0;
    do {
      *this->file_level_enum_descriptors_ =
           (EnumDescriptor *)(&descriptor->enum_types_->super_SymbolBase + lVar16);
      this->file_level_enum_descriptors_ = this->file_level_enum_descriptors_ + 1;
      lVar16 = lVar16 + 0x58;
    } while ((long)iVar6 * 0x58 - lVar16 != 0);
  }
  this->schemas_ = this->schemas_ + 1;
  this->default_instance_data_ = this->default_instance_data_ + 1;
  return;
}

Assistant:

void AssignMessageDescriptor(const Descriptor* descriptor) {
    for (int i = 0; i < descriptor->nested_type_count(); i++) {
      AssignMessageDescriptor(descriptor->nested_type(i));
    }

    // If there is no default instance we only want to initialize the descriptor
    // without updating the reflection.
    if (default_instance_data_[0] != nullptr) {
      auto& class_data = default_instance_data_[0]->GetClassData()->full();
      // If there is no descriptor_table in the class data, then it is not
      // interested in receiving reflection information either.
      if (class_data.descriptor_table != nullptr) {
        class_data.descriptor = descriptor;

        class_data.reflection = OnShutdownDelete(new Reflection(
            descriptor,
            MigrationToReflectionSchema(default_instance_data_, offsets_,
                                        *schemas_),
            DescriptorPool::internal_generated_pool(), factory_));
      }
    }
    for (int i = 0; i < descriptor->enum_type_count(); i++) {
      AssignEnumDescriptor(descriptor->enum_type(i));
    }
    schemas_++;
    default_instance_data_++;
  }